

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

void NJamSpell::ToLower(wstring *text)

{
  size_type sVar1;
  pointer pwVar2;
  undefined4 uVar3;
  long lVar4;
  
  sVar1 = text->_M_string_length;
  if (sVar1 != 0) {
    pwVar2 = (text->_M_dataplus)._M_p;
    lVar4 = 0;
    do {
      uVar3 = (**(code **)(*GWctype + 0x40))(GWctype,*(undefined4 *)((long)pwVar2 + lVar4));
      *(undefined4 *)((long)pwVar2 + lVar4) = uVar3;
      lVar4 = lVar4 + 4;
    } while (sVar1 << 2 != lVar4);
  }
  return;
}

Assistant:

void ToLower(std::wstring& text) {
    std::transform(text.begin(), text.end(), text.begin(), [](wchar_t wch) {
        return GWctype.tolower(wch);
    });
}